

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.h
# Opt level: O3

uint32_t __thiscall
asmjit::ZoneVector<asmjit::Pass_*>::indexOf(ZoneVector<asmjit::Pass_*> *this,Pass **val)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)(this->super_ZoneVectorBase)._size;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (*(Pass **)((long)(this->super_ZoneVectorBase)._data + uVar2 * 8) == *val) {
        return (uint32_t)uVar2;
      }
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  return 0xffffffff;
}

Assistant:

inline uint32_t indexOf(const T& val) const noexcept {
    const T* data = static_cast<const T*>(_data);
    uint32_t size = _size;

    for (uint32_t i = 0; i < size; i++)
      if (data[i] == val)
        return i;
    return Globals::kNotFound;
  }